

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O1

void __thiscall
Variable_parentlessUsingRemoveVariable_Test::~Variable_parentlessUsingRemoveVariable_Test
          (Variable_parentlessUsingRemoveVariable_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Variable, parentlessUsingRemoveVariable)
{
    libcellml::ModelPtr m = libcellml::Model::create();
    libcellml::ComponentPtr comp1 = libcellml::Component::create();

    libcellml::VariablePtr v1 = libcellml::Variable::create();

    m->setName("modelName");
    comp1->setName("component1");

    v1->setName("variable1");

    v1->setUnits("dimensionless");

    comp1->addVariable(v1);
    m->addComponent(comp1);

    EXPECT_TRUE(v1->hasParent());
    // Make a variable without a parent component.
    comp1->removeVariable(v1);

    EXPECT_EQ(size_t(0), comp1->variableCount());
    EXPECT_FALSE(v1->hasParent());
    EXPECT_EQ(nullptr, v1->parent());
}